

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O1

void __thiscall NaDynAr<double>::item::~item(item *this)

{
  if (this->pData == (double *)0x0) {
    NaPrintLog("data=0x%08p removed twice\n",0);
  }
  if (this->pData != (double *)0x0) {
    operator_delete(this->pData,8);
  }
  this->pData = (double *)0x0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }